

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::loadperiodtoweighting(aalcalc *this)

{
  mapped_type *pmVar1;
  float fVar2;
  size_t local_30;
  size_t i;
  undefined1 auStack_20 [4];
  Periods p;
  FILE *fin;
  aalcalc *this_local;
  
  p.weighting = (double)fopen("input/periods.bin","rb");
  if ((FILE *)p.weighting != (FILE *)0x0) {
    local_30 = fread((void *)((long)&i + 4),0xc,1,(FILE *)p.weighting);
    while (local_30 != 0) {
      fVar2 = (float)_auStack_20;
      pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](&this->periodstoweighting_,(key_type *)((long)&i + 4));
      *pmVar1 = (double)fVar2;
      local_30 = fread((void *)((long)&i + 4),0xc,1,(FILE *)p.weighting);
    }
  }
  return;
}

Assistant:

void aalcalc::loadperiodtoweighting()
{
	FILE *fin = fopen(PERIODS_FILE, "rb");
	if (fin == NULL) return;

	Periods p;
	size_t i = fread(&p, sizeof(Periods), 1, fin);
	while (i != 0) {
		periodstoweighting_[p.period_no] = (OASIS_FLOAT)p.weighting;		
		i = fread(&p, sizeof(Periods), 1, fin);
	}

}